

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O0

mz_bool tdefl_output_buffer_putter(void *pBuf,int len,void *pUser)

{
  size_t *size;
  void *pvVar1;
  ulong *in_RDX;
  int in_ESI;
  void *in_RDI;
  mz_uint8 *pNew_buf;
  size_t new_capacity;
  size_t new_size;
  tdefl_output_buffer *p;
  size_t *local_48;
  undefined8 in_stack_ffffffffffffffc0;
  
  size = (size_t *)(*in_RDX + (long)in_ESI);
  if ((size_t *)in_RDX[1] < size) {
    local_48 = (size_t *)in_RDX[1];
    if ((int)in_RDX[3] == 0) {
      return 0;
    }
    do {
      if ((ulong)((long)local_48 * 2) < 0x80) {
        local_48 = (size_t *)0x80;
      }
      else {
        local_48 = (size_t *)((long)local_48 << 1);
      }
    } while (local_48 < size);
    pvVar1 = crnlib::crnlib_realloc
                       (in_RDX,(size_t)size,local_48,
                        SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x38,0));
    if (pvVar1 == (void *)0x0) {
      return 0;
    }
    in_RDX[2] = (ulong)pvVar1;
    in_RDX[1] = (ulong)local_48;
  }
  memcpy((void *)(in_RDX[2] + *in_RDX),in_RDI,(long)in_ESI);
  *in_RDX = (ulong)size;
  return 1;
}

Assistant:

static mz_bool tdefl_output_buffer_putter(const void* pBuf, int len, void* pUser) {
  tdefl_output_buffer* p = (tdefl_output_buffer*)pUser;
  size_t new_size = p->m_size + len;
  if (new_size > p->m_capacity) {
    size_t new_capacity = p->m_capacity;
    mz_uint8* pNew_buf;
    if (!p->m_expandable)
      return MZ_FALSE;
    do {
      new_capacity = MZ_MAX(128U, new_capacity << 1U);
    } while (new_size > new_capacity);
    pNew_buf = (mz_uint8*)MZ_REALLOC(p->m_pBuf, new_capacity);
    if (!pNew_buf)
      return MZ_FALSE;
    p->m_pBuf = pNew_buf;
    p->m_capacity = new_capacity;
  }
  memcpy((mz_uint8*)p->m_pBuf + p->m_size, pBuf, len);
  p->m_size = new_size;
  return MZ_TRUE;
}